

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O3

uint32_t bech32_polymod_step(uint32_t pre)

{
  return -(uint)((pre & 0x10000000) == 0x10000000) & 0x3d4233dd ^
         -(uint)((pre & 0x4000000) == 0x4000000) & 0x26508e6d ^
         -(uint)((pre & 0x8000000) == 0x8000000) & 0x1ea119fa ^
         -(uint)((pre & 0x2000000) == 0x2000000) & 0x3b6a57b2 ^
         (int)(pre * 4) >> 0x1f & 0x2a1462b3U ^ (pre & 0x1ffffff) << 5;
}

Assistant:

static uint32_t bech32_polymod_step(uint32_t pre) {
    uint8_t b = pre >> 25;
    return ((pre & 0x1FFFFFF) << 5) ^
           (-((b >> 0) & 1) & 0x3b6a57b2UL) ^
           (-((b >> 1) & 1) & 0x26508e6dUL) ^
           (-((b >> 2) & 1) & 0x1ea119faUL) ^
           (-((b >> 3) & 1) & 0x3d4233ddUL) ^
           (-((b >> 4) & 1) & 0x2a1462b3UL);
}